

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::SFML::ProcessEvent(Event *event)

{
  Key KVar1;
  uint uVar2;
  ImGuiIO *pIVar3;
  int local_34;
  int i;
  ImGuiIO *io_1;
  int key;
  int button_1;
  int button;
  ImGuiIO *io;
  Event *event_local;
  
  if ((anonymous_namespace)::s_currWindowCtx != 0) {
    if ((*(byte *)((anonymous_namespace)::s_currWindowCtx + 0x38) & 1) != 0) {
      pIVar3 = GetIO();
      switch(event->type) {
      case TextEntered:
        if ((0x1f < (event->field_1).size.width) && ((event->field_1).size.width != 0x7f)) {
          ImGuiIO::AddInputCharacter(pIVar3,(event->field_1).size.width);
        }
        break;
      case KeyPressed:
      case KeyReleased:
        KVar1 = (event->field_1).key.code;
        if ((Unknown < KVar1) && (KVar1 < 0x285)) {
          pIVar3->KeysDown[KVar1] = event->type == KeyPressed;
        }
        pIVar3->KeyCtrl = (bool)((event->field_1).key.control & 1);
        pIVar3->KeyAlt = (bool)((event->field_1).key.alt & 1);
        pIVar3->KeyShift = (bool)((event->field_1).key.shift & 1);
        pIVar3->KeySuper = (bool)((event->field_1).key.system & 1);
        break;
      default:
        break;
      case MouseWheelScrolled:
        if (((event->field_1).size.width == 0) ||
           (((event->field_1).size.width == 1 && ((pIVar3->KeyShift & 1U) != 0)))) {
          pIVar3->MouseWheel = (event->field_1).mouseWheelScroll.delta + pIVar3->MouseWheel;
        }
        else if ((event->field_1).size.width == 1) {
          pIVar3->MouseWheelH = (event->field_1).mouseWheelScroll.delta + pIVar3->MouseWheelH;
        }
        break;
      case MouseButtonPressed:
      case MouseButtonReleased:
        KVar1 = (event->field_1).key.code;
        if (((event->type == MouseButtonPressed) && (Unknown < KVar1)) && (KVar1 < D)) {
          *(undefined1 *)
           ((anonymous_namespace)::s_currWindowCtx + 0x3a + (ulong)(event->field_1).size.width) = 1;
        }
        break;
      case MouseMoved:
        *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x39) = 1;
        break;
      case JoystickConnected:
        if (*(int *)((anonymous_namespace)::s_currWindowCtx + 0x50) == 8) {
          *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) = (event->field_1).size.width;
        }
        break;
      case JoystickDisconnected:
        if (*(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) == (event->field_1).size.width)
        {
          uVar2 = anon_unknown.dwarf_f6bf2::getConnectedJoystickId();
          *(uint *)((anonymous_namespace)::s_currWindowCtx + 0x50) = uVar2;
        }
        break;
      case TouchBegan:
      case TouchEnded:
        *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x39) = 0;
        KVar1 = (event->field_1).key.code;
        if (((event->type == TouchBegan) && (Unknown < KVar1)) && (KVar1 < D)) {
          *(undefined1 *)
           ((anonymous_namespace)::s_currWindowCtx + 0x44 + (ulong)(event->field_1).size.width) = 1;
        }
      }
    }
    if (event->type == LostFocus) {
      pIVar3 = GetIO();
      for (local_34 = 0; local_34 < 0x285; local_34 = local_34 + 1) {
        pIVar3->KeysDown[local_34] = false;
      }
      pIVar3->KeyCtrl = false;
      pIVar3->KeyAlt = false;
      pIVar3->KeyShift = false;
      pIVar3->KeySuper = false;
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x38) = 0;
    }
    else if (event->type == GainedFocus) {
      *(undefined1 *)((anonymous_namespace)::s_currWindowCtx + 0x38) = 1;
    }
    return;
  }
  __assert_fail("s_currWindowCtx && \"No current window is set - forgot to call ImGui::SFML::Init?\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                ,0x150,"void ImGui::SFML::ProcessEvent(const sf::Event &)");
}

Assistant:

void ProcessEvent(const sf::Event& event) {
    assert(s_currWindowCtx && "No current window is set - forgot to call ImGui::SFML::Init?");
    if (s_currWindowCtx->windowHasFocus) {
        ImGuiIO& io = ImGui::GetIO();

        switch (event.type) {
        case sf::Event::MouseMoved:
            s_currWindowCtx->mouseMoved = true;
            break;
        case sf::Event::MouseButtonPressed: // fall-through
        case sf::Event::MouseButtonReleased: {
            int button = event.mouseButton.button;
            if (event.type == sf::Event::MouseButtonPressed && button >= 0 && button < 3) {
                s_currWindowCtx->mousePressed[event.mouseButton.button] = true;
            }
        } break;
        case sf::Event::TouchBegan: // fall-through
        case sf::Event::TouchEnded: {
            s_currWindowCtx->mouseMoved = false;
            int button = event.touch.finger;
            if (event.type == sf::Event::TouchBegan && button >= 0 && button < 3) {
                s_currWindowCtx->touchDown[event.touch.finger] = true;
            }
        } break;
        case sf::Event::MouseWheelScrolled:
            if (event.mouseWheelScroll.wheel == sf::Mouse::VerticalWheel ||
                (event.mouseWheelScroll.wheel == sf::Mouse::HorizontalWheel && io.KeyShift)) {
                io.MouseWheel += event.mouseWheelScroll.delta;
            } else if (event.mouseWheelScroll.wheel == sf::Mouse::HorizontalWheel) {
                io.MouseWheelH += event.mouseWheelScroll.delta;
            }
            break;
        case sf::Event::KeyPressed: // fall-through
        case sf::Event::KeyReleased: {
            int key = event.key.code;
            if (key >= 0 && key < IM_ARRAYSIZE(io.KeysDown)) {
                io.KeysDown[key] = (event.type == sf::Event::KeyPressed);
            }
            io.KeyCtrl = event.key.control;
            io.KeyAlt = event.key.alt;
            io.KeyShift = event.key.shift;
            io.KeySuper = event.key.system;
        } break;
        case sf::Event::TextEntered:
            // Don't handle the event for unprintable characters
            if (event.text.unicode < ' ' || event.text.unicode == 127) {
                break;
            }
            io.AddInputCharacter(event.text.unicode);
            break;
        case sf::Event::JoystickConnected:
            if (s_currWindowCtx->joystickId == NULL_JOYSTICK_ID) {
                s_currWindowCtx->joystickId = event.joystickConnect.joystickId;
            }
            break;
        case sf::Event::JoystickDisconnected:
            if (s_currWindowCtx->joystickId == event.joystickConnect.joystickId) { // used gamepad
                                                                                   // was
                                                                                   // disconnected
                s_currWindowCtx->joystickId = getConnectedJoystickId();
            }
            break;
        default:
            break;
        }
    }

    switch (event.type) {
    case sf::Event::LostFocus: {
        // reset all input - SFML doesn't send KeyReleased
        // event when window goes out of focus
        ImGuiIO& io = ImGui::GetIO();
        for (int i = 0; i < IM_ARRAYSIZE(io.KeysDown); ++i) {
            io.KeysDown[i] = false;
        }
        io.KeyCtrl = false;
        io.KeyAlt = false;
        io.KeyShift = false;
        io.KeySuper = false;

        s_currWindowCtx->windowHasFocus = false;
    } break;
    case sf::Event::GainedFocus:
        s_currWindowCtx->windowHasFocus = true;
        break;
    default:
        break;
    }
}